

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

MSize crec_fill_unroll(CRecMemList *ml,CTSize len,CTSize step)

{
  int iVar1;
  IRType tp;
  MSize mlp;
  CTSize ofs;
  CTSize step_local;
  CTSize len_local;
  CRecMemList *ml_local;
  
  ofs = 0;
  mlp = 0;
  iVar1 = 0x1f;
  if (step != 0) {
    for (; step >> iVar1 == 0; iVar1 = iVar1 + -1) {
    }
  }
  tp = iVar1 * 2 + IRT_U8;
  step_local = step;
  do {
    for (; ofs + step_local <= len; ofs = step_local + ofs) {
      if (0xf < mlp) {
        return 0;
      }
      ml[mlp].ofs = ofs;
      ml[mlp].tp = tp;
      mlp = mlp + 1;
    }
    step_local = step_local >> 1;
    tp = tp - IRT_TRUE;
  } while (ofs < len);
  return mlp;
}

Assistant:

static MSize crec_fill_unroll(CRecMemList *ml, CTSize len, CTSize step)
{
  CTSize ofs = 0;
  MSize mlp = 0;
  IRType tp = IRT_U8 + 2*lj_fls(step);
  do {
    while (ofs + step <= len) {
      if (mlp >= CREC_COPY_MAXUNROLL) return 0;
      ml[mlp].ofs = ofs;
      ml[mlp].tp = tp;
      mlp++;
      ofs += step;
    }
    step >>= 1;
    tp -= 2;
  } while (ofs < len);
  return mlp;
}